

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::~IfcElementAssembly(IfcElementAssembly *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70 = 0x84ecf0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x58 = 0x84ede0;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.Representation.have = 0x84ed18;
  *(undefined8 *)&this[-1].super_IfcElement.super_IfcProduct.field_0x108 = 0x84ed40;
  *(undefined8 *)&this[-1].super_IfcElement.field_0x140 = 0x84ed68;
  this[-1].PredefinedType._M_dataplus._M_p = (pointer)0x84ed90;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x84edb8;
  puVar1 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x38;
  if (puVar1 != &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x48) {
    operator_delete(puVar1);
  }
  puVar1 = &this[-1].super_IfcElement.super_IfcProduct.super_IfcObject.field_0x70;
  puVar2 = *(undefined1 **)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x10;
  if (puVar2 != &(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x20) {
    operator_delete(puVar2);
  }
  IfcElement::~IfcElement((IfcElement *)puVar1,&PTR_construction_vtable_24__0084edf8);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}